

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O1

Monom<Kernel::NumTraits<Kernel::RealConstantType>_> * __thiscall
Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>
          (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *__return_storage_ptr__,
          Inferences *this,Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in,
          PolyNf *simplifiedArgs,bool removeZeros)

{
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:364:18),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  it;
  undefined1 auVar1 [32];
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  *pDVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 *puVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *this_00;
  ulong uVar9;
  int iVar10;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar11;
  bool bVar12;
  anon_class_16_2_20c48a23 f;
  anon_class_16_2_f84bbffd f_00;
  anon_class_16_2_f84bbffd f_01;
  anon_class_16_2_f84bbffd f_02;
  anon_class_16_2_f84bbffd f_03;
  anon_class_16_2_f84bbffd f_04;
  anon_class_16_2_f84bbffd f_05;
  anon_class_16_2_f84bbffd f_06;
  anon_class_1_0_00000001 pow;
  int power;
  Option<Kernel::RealConstantType> c;
  Numeral numeral;
  PolyNf term;
  anon_class_1_0_00000001 local_229;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_228;
  undefined1 local_202;
  anon_class_1_0_00000001 local_201;
  ulong local_200;
  undefined1 local_1f8 [8];
  _Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:922:7)_&,_false>
  _Stack_1f0;
  _Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:921:7)_&,_false>
  local_1e8;
  int local_1e0;
  undefined4 local_1cc;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_1c8;
  undefined1 local_1c0 [40];
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  local_198;
  int local_180;
  RationalConstantType local_178;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_158;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_138;
  ulong local_120;
  __mpz_struct local_118;
  __mpz_struct local_108;
  uint local_f0 [2];
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_e8;
  undefined1 *local_e0;
  long lStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  unsigned_long local_c0;
  RealConstantType local_b8;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> local_98;
  RealConstantType local_70;
  RealConstantType local_50;
  
  local_1cc = SUB84(simplifiedArgs,0);
  uVar9 = *(ulong *)(this + 0x28);
  Kernel::RealConstantType::RealConstantType
            ((RealConstantType *)&local_178,(RealConstantType *)this);
  uVar4 = (int)((ulong)(*(long *)(uVar9 + 0x10) - *(long *)(uVar9 + 8)) >> 2) * -0x49249249;
  local_228._capacity = (size_t)uVar4;
  local_200 = uVar9;
  local_1c8 = __return_storage_ptr__;
  if (uVar4 == 0) {
    local_228._stack = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  }
  else {
    uVar9 = local_228._capacity * 0x1c + 0xf & 0x3ffffffff0;
    if (uVar9 == 0) {
      local_228._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           ::Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar9 < 0x11) {
      local_228._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           ::Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar9 < 0x19) {
      local_228._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           ::Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar9 < 0x21) {
      local_228._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           ::Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar9 < 0x31) {
      local_228._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           ::Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar9 < 0x41) {
      local_228._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           ::Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_228._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)::operator_new(uVar9,0x10);
    }
  }
  local_228._end = local_228._stack + local_228._capacity;
  lVar6 = *(long *)(local_200 + 8);
  local_228._cursor = local_228._stack;
  if ((int)((ulong)(*(long *)(local_200 + 0x10) - lVar6) >> 2) * -0x49249249 != 0) {
    lVar8 = 0x18;
    uVar9 = 0;
    do {
      local_1f8._0_4_ = *(undefined4 *)(lVar6 + lVar8);
      if ((((in->numeral).super_RationalConstantType._num._val[0]._mp_alloc & 3) == 2) &&
         (((in->numeral).super_RationalConstantType._num._val[0]._mp_alloc & 0x300) == 0x200)) {
        puVar5 = (undefined1 *)
                 ((long)&(in->numeral).super_RationalConstantType._num._val[0]._mp_alloc + 2);
      }
      else {
        puVar5 = (undefined1 *)0x0;
      }
      if (puVar5 == (undefined1 *)0x0) {
LAB_00515678:
        bVar12 = false;
      }
      else {
        lVar6 = *(long *)(puVar5 + 8);
        uVar4 = (int)((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8)) >> 4) * -0x55555555;
        bVar12 = uVar4 == 1;
        if (bVar12) {
          local_120 = (ulong)uVar4;
          Kernel::RealConstantType::RealConstantType(&local_50,*(RealConstantType **)(lVar6 + 8));
          simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>_>::anon_class_1_0_00000001::
          operator()((Numeral *)local_1c0,&local_229,&local_50,local_1f8._0_4_);
          Kernel::RationalConstantType::operator*=(&local_178,(RationalConstantType *)local_1c0);
          mpz_clear((__mpz_struct *)(local_1c0 + 0x10));
          mpz_clear((__mpz_struct *)local_1c0);
          mpz_clear(local_50.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_50);
          lStack_d8 = *(long *)(*(long *)(lVar6 + 8) + 0x28);
          local_c0 = (*(long *)(lStack_d8 + 0x10) - *(long *)(lStack_d8 + 8) >> 2) *
                     0x6db6db6db6db6db7;
          local_d0 = 0;
          uStack_c8 = 0;
          local_e0 = local_1f8;
          auVar1 = ZEXT1632(CONCAT88(lStack_d8,local_e0));
          it._iter._inner._inner._to = local_c0;
          it._iter._func.power = (int *)auVar1._0_8_;
          it._iter._inner._func.a =
               (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
               auVar1._8_8_;
          it._iter._inner._inner._next = auVar1._16_8_;
          it._iter._inner._inner._from = auVar1._24_8_;
          ::Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>::
          loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>,Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::PolyNf*,bool)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>
                    ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>> *)
                     &local_228,it);
          uVar4 = (uint)local_120;
        }
        if (uVar4 != 1) goto LAB_00515678;
      }
      if (!bVar12) {
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[7] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[8] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[9] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[10] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xb] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xc] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xd] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xe] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xf] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x10] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x11] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x12] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x13] = '\0';
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._21_3_ = 0;
        local_138.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._0_8_ = (ulong)(byte)(in->numeral).super_RationalConstantType._num._val[0]._mp_alloc &
                 0xffffffffffffff03;
        f_00.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                      *)in;
        f_00.this = &local_138;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                    *)&local_138,f_00);
        uVar3 = local_1f8._0_4_;
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[7] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[8] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[9] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[10] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xb] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xc] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xd] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xe] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0xf] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x10] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x11] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x12] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content[0x13] = '\0';
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._21_3_ = 0;
        local_198.
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._0_8_ = local_138.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._0_8_ & 3;
        f_01.other = &local_138;
        f_01.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)&local_198;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                    *)&local_198,f_01);
        local_180 = uVar3;
        if (local_228._cursor == local_228._end) {
          ::Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                    (&local_228);
        }
        pMVar11 = local_228._cursor;
        *(undefined8 *)
         &((local_228._cursor)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = 0;
        pDVar2 = &((local_228._cursor)->term).super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        ;
        (pDVar2->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[7] = '\0';
        (pDVar2->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[8] = '\0';
        (pDVar2->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[9] = '\0';
        (pDVar2->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[10] = '\0';
        (pDVar2->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[0xb] = '\0';
        (pDVar2->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[0xc] = '\0';
        (pDVar2->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[0xd] = '\0';
        (pDVar2->
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        )._content[0xe] = '\0';
        *(undefined8 *)
         (((local_228._cursor)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content + 0xf) = 0;
        *(byte *)&((local_228._cursor)->term).super_PolyNfSuper._inner.
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                  .
                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = local_198.
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._0_1_ & 3;
        f_02.other = &local_198;
        f_02.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     *)local_228._cursor;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                    *)local_228._cursor,f_02);
        pMVar11->power = local_180;
        local_228._cursor = local_228._cursor + 1;
      }
      uVar9 = uVar9 + 1;
      lVar6 = *(long *)(local_200 + 8);
      in = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           &(in->numeral).super_RationalConstantType._den._val[0]._mp_d;
      lVar8 = lVar8 + 0x1c;
    } while (uVar9 < (uint)((int)((ulong)(*(long *)(local_200 + 0x10) - lVar6) >> 2) * -0x49249249))
    ;
  }
  pMVar11 = local_228._stack;
  if (local_228._stack != local_228._cursor) {
    uVar9 = ((long)local_228._cursor - (long)local_228._stack >> 2) * 0x6db6db6db6db6db7;
    lVar6 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_228._stack,local_228._cursor,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
              (pMVar11);
  }
  uVar9 = 0;
  if (local_228._cursor != local_228._stack) {
    local_200 = local_200 & 0xffffffff00000000;
    do {
      pMVar11 = local_228._stack + uVar9;
      local_1f8 = (undefined1  [8])&local_202;
      f.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                *)pMVar11;
      f.fs_ = (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:921:7)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:922:7)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&>
               *)local_1f8;
      _Stack_1f0._M_head_impl = &local_201;
      local_1e8._M_head_impl = (anon_class_1_0_00000001 *)&local_118;
      ::Lib::CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
      ::
      switchN<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>::match<Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_>(Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_)const&::_lambda(auto:1)_1_>
                ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict27
                  *)local_1c0,
                 (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                  *)pMVar11,f);
      if (local_1c0[0] == true) {
        Kernel::RealConstantType::RealConstantType(&local_70,(RealConstantType *)(local_1c0 + 8));
        simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>_>::anon_class_1_0_00000001::
        operator()((Numeral *)local_1f8,&local_229,&local_70,pMVar11->power);
        mpz_clear(local_70.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_70);
        Kernel::RealConstantType::operator*
                  ((RealConstantType *)&local_118,(RealConstantType *)&local_178,
                   (RealConstantType *)local_1f8);
        mpz_set((__mpz_struct *)&local_178,&local_118);
        mpz_set(local_178._den._val,&local_108);
        mpz_clear(&local_108);
        mpz_clear(&local_118);
        mpz_clear((__mpz_struct *)&local_1e8);
        mpz_clear((__mpz_struct *)local_1f8);
      }
      else {
        local_118._mp_d = (mp_limb_t *)0x0;
        local_108._mp_alloc = 0;
        local_108._mp_size = 0;
        local_118._0_8_ =
             (ulong)*(byte *)&(pMVar11->term).super_PolyNfSuper._inner.
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                              .
                              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             & 0xffffffffffffff03;
        f_03.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                      *)pMVar11;
        f_03.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)&local_118;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::
        switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                    *)&local_118,f_03);
        iVar10 = pMVar11->power;
        uVar4 = (int)uVar9 + 1;
        lVar6 = (long)local_228._cursor - (long)local_228._stack;
        while ((uVar7 = (ulong)uVar4, uVar7 < (ulong)((lVar6 >> 2) * 0x6db6db6db6db6db7) &&
               (bVar12 = Kernel::operator==(&local_228._stack[uVar7].term,(PolyNf *)&local_118),
               bVar12))) {
          iVar10 = iVar10 + local_228._stack[uVar7].power;
          uVar4 = (int)uVar9 + 2;
          lVar6 = (long)local_228._cursor - (long)local_228._stack;
          uVar9 = (ulong)((int)uVar9 + 1);
        }
        if (iVar10 != 0) {
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[7] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[8] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[9] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[10] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xb] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xc] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xd] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xe] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0xf] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x10] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x11] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x12] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._content[0x13] = '\0';
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._21_3_ = 0;
          local_158.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._0_8_ = local_118._0_8_ & 3;
          f_04.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                        *)&local_118;
          f_04.this = &local_158;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)&local_158,f_04);
          _Stack_1f0._M_head_impl = (anon_class_1_0_00000001 *)0x0;
          local_1e8._M_head_impl = (anon_class_1_0_00000001 *)0x0;
          local_1f8 = (undefined1  [8])
                      (local_158.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._0_8_ & 3);
          f_05.other = &local_158;
          f_05.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)local_1f8;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)local_1f8,f_05);
          pMVar11 = local_228._stack + (int)local_200;
          local_1e0 = iVar10;
          if (pMVar11 != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_1f8) {
            *(undefined8 *)
             &(pMVar11->term).super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 = 0;
            pDVar2 = &(pMVar11->term).super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            ;
            (pDVar2->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[7] = '\0';
            (pDVar2->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[8] = '\0';
            (pDVar2->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[9] = '\0';
            (pDVar2->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[10] = '\0';
            (pDVar2->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xb] = '\0';
            (pDVar2->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xc] = '\0';
            (pDVar2->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xd] = '\0';
            (pDVar2->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xe] = '\0';
            *(undefined8 *)
             ((pMVar11->term).super_PolyNfSuper._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ._content + 0xf) = 0;
            *(byte *)&(pMVar11->term).super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 = local_1f8[0] & 3;
            f_06.other = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          *)local_1f8;
            f_06.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         *)pMVar11;
            ::Lib::CoproductImpl::
            RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
            ::
            switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                      ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                        *)pMVar11,f_06);
          }
          pMVar11->power = local_1e0;
          local_200 = CONCAT44(local_200._4_4_,(int)local_200 + 1);
        }
      }
      ::Lib::OptionBase<Kernel::RealConstantType>::~OptionBase
                ((OptionBase<Kernel::RealConstantType> *)local_1c0);
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar7 = ((long)local_228._cursor - (long)local_228._stack >> 2) * 0x6db6db6db6db6db7;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
    uVar9 = (ulong)(int)local_200;
  }
  local_228._cursor = local_228._stack + uVar9;
  Kernel::RealConstantType::RealConstantType((RealConstantType *)local_1c0,0);
  bVar12 = Kernel::RationalConstantType::operator==(&local_178,(RationalConstantType *)local_1c0);
  mpz_clear((__mpz_struct *)(local_1c0 + 0x10));
  mpz_clear((__mpz_struct *)local_1c0);
  this_00 = local_1c8;
  if ((bVar12 & (byte)local_1cc) == 0) {
    Kernel::RealConstantType::RealConstantType(&local_b8,(RealConstantType *)&local_178);
    this_00 = local_1c8;
    local_98._factors._cursor = local_228._cursor;
    local_98._factors._capacity = local_228._capacity;
    local_228._capacity = 0;
    local_98._factors._end = local_228._end;
    local_228._end = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    local_228._cursor = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    local_98._factors._stack = local_228._stack;
    local_228._stack = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    ::Lib::
    perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)local_f0,&local_98);
    Kernel::RealConstantType::RealConstantType(&this_00->numeral,&local_b8);
    (this_00->factors)._id = local_f0[0];
    (this_00->factors)._ptr = local_e8;
    if (local_98._factors._stack != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0
       ) {
      uVar9 = local_98._factors._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
      if (uVar9 == 0) {
        *(undefined8 *)
         &((local_98._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_98._factors._stack;
      }
      else if (uVar9 < 0x11) {
        *(undefined8 *)
         &((local_98._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_98._factors._stack;
      }
      else if (uVar9 < 0x19) {
        *(undefined8 *)
         &((local_98._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_98._factors._stack;
      }
      else if (uVar9 < 0x21) {
        *(undefined8 *)
         &((local_98._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_98._factors._stack;
      }
      else if (uVar9 < 0x31) {
        *(undefined8 *)
         &((local_98._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_98._factors._stack;
      }
      else if (uVar9 < 0x41) {
        *(undefined8 *)
         &((local_98._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_98._factors._stack;
      }
      else {
        operator_delete(local_98._factors._stack,0x10);
      }
    }
    mpz_clear(local_b8.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_b8);
  }
  else {
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::zero();
  }
  if (local_228._stack != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0) {
    uVar9 = local_228._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar9 == 0) {
      *(undefined8 *)
       &((local_228._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_228._stack;
    }
    else if (uVar9 < 0x11) {
      *(undefined8 *)
       &((local_228._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_228._stack;
    }
    else if (uVar9 < 0x19) {
      *(undefined8 *)
       &((local_228._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_228._stack;
    }
    else if (uVar9 < 0x21) {
      *(undefined8 *)
       &((local_228._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_228._stack;
    }
    else if (uVar9 < 0x31) {
      *(undefined8 *)
       &((local_228._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_228._stack;
    }
    else if (uVar9 < 0x41) {
      *(undefined8 *)
       &((local_228._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_228._stack;
    }
    else {
      operator_delete(local_228._stack,0x10);
    }
  }
  mpz_clear(local_178._den._val);
  mpz_clear((__mpz_struct *)&local_178);
  return this_00;
}

Assistant:

Monom<Number> simplifyMonom(Monom<Number> const& in, PolyNf* simplifiedArgs, bool removeZeros)
{ 

  using Numeral      = typename Number::ConstantType;
  using Monom        = Monom<Number>;
  using MonomFactor  = MonomFactor<Number>;
  using MonomFactors = MonomFactors<Number>;

  auto pow = [](Numeral c, int power) -> Numeral {
    ASS(power > 0)
    auto out = c;
    while (--power > 0) {
      out = out * c;
    }
    return out;
  };

  
  auto& facs = *in.factors;
  auto numeral = in.numeral;
  Stack<MonomFactor> args(facs.nFactors());
  for (unsigned i = 0; i < facs.nFactors(); i++) {
    auto power = facs.factorAt(i).power;
    if (auto poly_ = simplifiedArgs[i].downcast<Number>()) {
      auto& poly = **poly_;
      if (poly.nSummands() == 1) {
        numeral *= pow(poly.summandAt(0).numeral, power);
        args.loadFromIterator(
            poly.summandAt(0).factors->iter()
            .map([&](auto fac) { fac.power *= power; return fac; }));
        continue;
      }
    }
    args.push(MonomFactor(simplifiedArgs[i], power));
  }

  std::sort(args.begin(), args.end());

  auto offs = 0;
  bool needsSorting = false;

  for (unsigned i = 0; i < args.size(); i++) {
    auto& arg = args[i];
    auto c = arg.term.template tryNumeral<Number>();
    if (c.isSome()) {
      // arg is a number constant
      auto num2 = pow(c.unwrap(), arg.power);
      numeral = numeral * num2;
    } else {
      // arg is a non-number term
      auto term  = arg.term;
      auto power = arg.power;
      while (i + 1 < args.size() && args[i + 1].term == term) {
        power += args[i + 1].power;
        i++;
      }
      if (power != 0) {
        args[offs++] = MonomFactor(term, power);
      }
    }
  }
  args.truncate(offs);

  if (needsSorting) {
    std::sort(args.begin(), args.end());
  }

  if (numeral == Numeral(0) && removeZeros) {
    return Monom::zero();
  } else {
    return Monom(numeral, perfect(MonomFactors(std::move(args))));
  }
}